

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPTCPTransmitter::SendRTPRTCPData(RTPTCPTransmitter *this,void *data,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  _Base_ptr p_Var3;
  size_t i;
  ulong uVar4;
  uint8_t lengthBytes [2];
  SocketType sock;
  vector<int,_std::allocator<int>_> errSockets;
  
  iVar1 = -0xb5;
  if (((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) &&
     (iVar1 = -0xc0, len < 0x10000)) {
    p_Var3 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (; (_Rb_tree_header *)p_Var3 != &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      lengthBytes[1] = (uint8_t)len;
      sock = p_Var3[1]._M_color;
      lengthBytes[0] = (uint8_t)(len >> 8);
      sVar2 = send(sock,lengthBytes,2,0x4000);
      if (sVar2 < 0) {
LAB_0012d335:
        std::vector<int,_std::allocator<int>_>::push_back(&errSockets,&sock);
      }
      else {
        sVar2 = send(sock,data,len,0x4000);
        if (sVar2 < 0) goto LAB_0012d335;
      }
    }
    if (errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      for (uVar4 = 0;
          uVar4 < (ulong)((long)errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x21])
                  (this,(ulong)(uint)errSockets.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&errSockets.super__Vector_base<int,_std::allocator<int>_>);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::SendRTPRTCPData(const void *data, size_t len)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (len > RTPTCPTRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SPECIFIEDSIZETOOBIG;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();

	vector<SocketType> errSockets;
	int flags = 0;
#ifdef RTP_HAVE_MSG_NOSIGNAL
	flags = MSG_NOSIGNAL;
#endif // RTP_HAVE_MSG_NOSIGNAL

	while (it != end)
	{
		uint8_t lengthBytes[2] = { (uint8_t)((len >> 8)&0xff), (uint8_t)(len&0xff) };
		SocketType sock = it->first;

		if (send(sock,(const char *)lengthBytes,2,flags) < 0 ||
			send(sock,(const char *)data,len,flags) < 0)
			errSockets.push_back(sock);
		++it;
	}
	
	MAINMUTEX_UNLOCK

	if (errSockets.size() != 0)
	{
		for (size_t i = 0 ; i < errSockets.size() ; i++)
			OnSendError(errSockets[i]);
	}

	// Don't return an error code to avoid the poll thread exiting
	// due to one closed connection for example

	return 0;
}